

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O0

void google::protobuf::
     STLDeleteValues<std::map<google::protobuf::FieldDescriptor_const*,google::protobuf::TextFormat::FieldValuePrinter_const*,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::TextFormat::FieldValuePrinter_const*>>>>
               (map<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::TextFormat::FieldValuePrinter_*>_>_>
                *v)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_20;
  _Self local_18;
  iterator i;
  map<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::TextFormat::FieldValuePrinter_*>_>_>
  *v_local;
  
  if (v != (map<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::TextFormat::FieldValuePrinter_*>_>_>
            *)0x0) {
    i._M_node = (_Base_ptr)v;
    local_18._M_node =
         (_Base_ptr)
         std::
         map<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::TextFormat::FieldValuePrinter_*>_>_>
         ::begin(v);
    while( true ) {
      local_20._M_node =
           (_Base_ptr)
           std::
           map<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::TextFormat::FieldValuePrinter_*>_>_>
           ::end(i._M_node);
      bVar1 = std::operator!=(&local_18,&local_20);
      if (!bVar1) break;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::TextFormat::FieldValuePrinter_*>_>
               ::operator->(&local_18);
      if (ppVar2->second != (FieldValuePrinter *)0x0) {
        (*ppVar2->second->_vptr_FieldValuePrinter[1])();
      }
      std::
      _Rb_tree_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::TextFormat::FieldValuePrinter_*>_>
      ::operator++(&local_18);
    }
    std::
    map<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::TextFormat::FieldValuePrinter_*>_>_>
    ::clear((map<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::TextFormat::FieldValuePrinter_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_const_google::protobuf::TextFormat::FieldValuePrinter_*>_>_>
             *)i._M_node);
  }
  return;
}

Assistant:

void STLDeleteValues(T *v) {
  if (!v) return;
  for (typename T::iterator i = v->begin(); i != v->end(); ++i) {
    delete i->second;
  }
  v->clear();
}